

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void os_banner_set_attr(void *banner_handle,int attr)

{
  osgen_win_t *win;
  char buf [3];
  char local_3 [3];
  
  if ((*(int *)((long)banner_handle + 100) != attr) && (*banner_handle == 1)) {
    ossaddsb((osgen_txtwin_t *)banner_handle,local_3,2,1);
  }
  return;
}

Assistant:

void os_banner_set_attr(void *banner_handle, int attr)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;
    char buf[3];

    /* if the attributes aren't changing, ignore it */
    if (attr == win->txtattr)
        return;

    /* set the attribute according to the window type */
    switch(win->win_type)
    {
    case OS_BANNER_TYPE_TEXT:
        /* add the color sequence to the window's scrollback buffer */
        buf[0] = OSGEN_ATTR;
        buf[1] = (char)attr;
        ossaddsb((osgen_txtwin_t *)win, buf, 2, TRUE);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /* text grid windows don't use attributes - ignore it */
        break;
    }
}